

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall
fasttext::Dictionary::getSubwords
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *substrings)

{
  pointer piVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t i;
  int32_t local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = getId(this,word);
  piVar1 = (ngrams->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((ngrams->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (ngrams->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  local_74 = iVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(substrings);
  if (-1 < iVar3) {
    std::vector<int,_std::allocator<int>_>::push_back(ngrams,&local_74);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(substrings,
                &(this->words_).
                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                 super__Vector_impl_data._M_start[local_74].word);
  }
  bVar2 = std::operator!=(word,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               EOS_abi_cxx11_);
  if (bVar2) {
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   BOW_abi_cxx11_,word);
    std::operator+(&local_70,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   EOW_abi_cxx11_);
    computeSubwords(this,&local_70,ngrams,substrings);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Dictionary::getSubwords(
		const std::string& word,
		std::vector<int32_t>& ngrams,
		std::vector<std::string>& substrings) const {
	int32_t i = getId(word);
	ngrams.clear();
	substrings.clear();
	if (i >= 0) {
		ngrams.push_back(i);
		substrings.push_back(words_[i].word);
	}
	if (word != EOS) {
		computeSubwords(BOW + word + EOW, ngrams, &substrings);
	}
}